

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O1

string * __thiscall
higan::LogFile::GetFileName_abi_cxx11_(string *__return_storage_ptr__,LogFile *this)

{
  pointer pcVar1;
  long lVar2;
  tm *__tp;
  long *plVar3;
  size_type *psVar4;
  char local_78 [8];
  char buffer [32];
  time_t local_50;
  time_t now;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  local_50 = time((time_t *)0x0);
  __tp = localtime(&local_50);
  strftime(local_78,0x20,".%Y%m%d-%H%M%S.",__tp);
  pcVar1 = (this->log_dir_)._M_dataplus._M_p;
  now = (time_t)&__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&now,pcVar1,pcVar1 + (this->log_dir_)._M_string_length);
  std::__cxx11::string::append((char *)&now);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&now,(ulong)(this->log_prefix_)._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((size_type *)now != &__str._M_string_length) {
    operator_delete((void *)now,__str._M_string_length + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string LogFile::GetFileName()
{
	time_t now = time(nullptr);

	struct tm* tm_now = localtime(&now);

	char buffer[32];

	strftime(buffer, sizeof buffer, ".%Y%m%d-%H%M%S.", tm_now);

	std::string result_name = log_dir_ + "/" + log_prefix_;
	result_name.append(buffer);
	result_name += "log";

	return result_name;
}